

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O0

int * Abc_FrameReadMiniAigEquivClasses(Abc_Frame_t *pAbc)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  int *piVar3;
  int *pRes;
  Vec_Int_t *vRes;
  Abc_Frame_t *pAbc_local;
  
  if (pAbc->pGiaMiniAig == (Gia_Man_t *)0x0) {
    printf("GIA derived from MiniAig is not available.\n");
  }
  if (pAbc->vCopyMiniAig == (Vec_Int_t *)0x0) {
    printf("Mapping of MiniAig nodes is not available.\n");
  }
  if (pAbc->pGia2 == (Gia_Man_t *)0x0) {
    printf("Internal GIA with equivalence classes is not available.\n");
  }
  if (pAbc->pGia2->pReprs == (Gia_Rpr_t *)0x0) {
    printf("Equivalence classes of internal GIA are not available.\n");
  }
  iVar1 = Gia_ManObjNum(pAbc->pGia2);
  iVar2 = Gia_ManObjNum(pAbc->pGiaMiniAig);
  if (iVar1 != iVar2) {
    printf("Internal GIA with equivalence classes is not directly derived from MiniAig.\n");
  }
  p = Gia_ManMapEquivAfterScorr(pAbc->pGia2,pAbc->vCopyMiniAig);
  piVar3 = Vec_IntReleaseArray(p);
  Vec_IntFree(p);
  return piVar3;
}

Assistant:

int * Abc_FrameReadMiniAigEquivClasses( Abc_Frame_t * pAbc )
{
    Vec_Int_t * vRes;
    int * pRes;
    if ( pAbc->pGiaMiniAig == NULL )
        printf( "GIA derived from MiniAig is not available.\n" );
    if ( pAbc->vCopyMiniAig == NULL )
        printf( "Mapping of MiniAig nodes is not available.\n" );
    if ( pAbc->pGia2 == NULL )
        printf( "Internal GIA with equivalence classes is not available.\n" );
    if ( pAbc->pGia2->pReprs == NULL )
        printf( "Equivalence classes of internal GIA are not available.\n" );
    if ( Gia_ManObjNum(pAbc->pGia2) != Gia_ManObjNum(pAbc->pGiaMiniAig) )
        printf( "Internal GIA with equivalence classes is not directly derived from MiniAig.\n" );
    // derive the set of equivalent node pairs
    vRes = Gia_ManMapEquivAfterScorr( pAbc->pGia2, pAbc->vCopyMiniAig );
    pRes = Vec_IntReleaseArray( vRes );
    Vec_IntFree( vRes );
    return pRes;
}